

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O0

void jpc_qmfb_split_row(jpc_fix_t *a,uint numcols,uint parity)

{
  uint uVar1;
  ulong num_elements;
  uint local_804c;
  int local_8048;
  uint n_2;
  uint n_1;
  uint n;
  uint m;
  uint hstartcol;
  size_t bufsize;
  jpc_fix_t *dstptr;
  jpc_fix_t *srcptr;
  jpc_fix_t *buf;
  jpc_fix_t splitbuf [4096];
  uint parity_local;
  uint numcols_local;
  jpc_fix_t *a_local;
  
  srcptr = (jpc_fix_t *)&buf;
  num_elements = (ulong)(numcols + 1 >> 1);
  splitbuf[0xfff]._0_4_ = parity;
  splitbuf[0xfff]._4_4_ = numcols;
  if ((0x1000 < num_elements) &&
     (srcptr = (jpc_fix_t *)jas_alloc2(num_elements,8), srcptr == (jpc_fix_t *)0x0)) {
    abort();
  }
  if (1 < splitbuf[0xfff]._4_4_) {
    uVar1 = (splitbuf[0xfff]._4_4_ + 1) - (uint)splitbuf[0xfff] >> 1;
    bufsize = (size_t)srcptr;
    dstptr = a + (1 - (uint)splitbuf[0xfff]);
    local_804c = splitbuf[0xfff]._4_4_ - uVar1;
    for (n_2 = local_804c; n_2 != 0; n_2 = n_2 - 1) {
      *(jpc_fix_t *)bufsize = *dstptr;
      bufsize = bufsize + 8;
      dstptr = dstptr + 2;
    }
    bufsize = (size_t)(a + (1 - (uint)splitbuf[0xfff]));
    dstptr = a + (2 - (uint)splitbuf[0xfff]);
    for (local_8048 = (splitbuf[0xfff]._4_4_ - local_804c) -
                      (uint)(((uint)splitbuf[0xfff] != 0 ^ 0xffU) & 1); local_8048 != 0;
        local_8048 = local_8048 + -1) {
      *(jpc_fix_t *)bufsize = *dstptr;
      bufsize = bufsize + 8;
      dstptr = dstptr + 2;
    }
    bufsize = (size_t)(a + uVar1);
    dstptr = srcptr;
    for (; local_804c != 0; local_804c = local_804c - 1) {
      *(jpc_fix_t *)bufsize = *dstptr;
      bufsize = bufsize + 8;
      dstptr = dstptr + 1;
    }
  }
  if ((jpc_fix_t **)srcptr != &buf) {
    jas_free(srcptr);
  }
  return;
}

Assistant:

static void jpc_qmfb_split_row(jpc_fix_t *a, unsigned numcols, unsigned parity)
{
	jpc_fix_t splitbuf[QMFB_SPLITBUFSIZE];
	jpc_fix_t *buf = splitbuf;
	register jpc_fix_t *srcptr;
	register jpc_fix_t *dstptr;

	/* Get a buffer. */
	const size_t bufsize = JPC_CEILDIVPOW2(numcols, 1);
	if (bufsize > QMFB_SPLITBUFSIZE) {
		if (!(buf = jas_alloc2(bufsize, sizeof(jpc_fix_t)))) {
			/* We have no choice but to commit suicide in this case. */
			abort();
		}
	}

	if (numcols >= 2) {
		const unsigned hstartcol = (numcols + 1 - parity) >> 1;
		// ORIGINAL (WRONG): m = (parity) ? hstartcol : (numcols - hstartcol);
		const unsigned m = numcols - hstartcol;

		/* Save the samples destined for the highpass channel. */
		dstptr = buf;
		srcptr = &a[1 - parity];
		for (unsigned n = m; n > 0; --n) {
			*dstptr = *srcptr;
			++dstptr;
			srcptr += 2;
		}
		/* Copy the appropriate samples into the lowpass channel. */
		dstptr = &a[1 - parity];
		srcptr = &a[2 - parity];
		for (unsigned n = numcols - m - (!parity); n > 0; --n) {
			*dstptr = *srcptr;
			++dstptr;
			srcptr += 2;
		}
		/* Copy the saved samples into the highpass channel. */
		dstptr = &a[hstartcol];
		srcptr = buf;
		for (unsigned n = m; n > 0; --n) {
			*dstptr = *srcptr;
			++dstptr;
			++srcptr;
		}
	}

	/* If the split buffer was allocated on the heap, free this memory. */
	if (buf != splitbuf) {
		jas_free(buf);
	}

}